

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pugixml.cpp
# Opt level: O0

bool __thiscall pugi::xml_node::remove_children(xml_node *this)

{
  bool bVar1;
  xml_allocator *this_00;
  xml_node_struct *in_RDI;
  xml_node_struct *next;
  xml_node_struct *cur;
  xml_allocator *alloc;
  long local_20;
  xml_node_struct *n;
  bool local_1;
  
  if (in_RDI->header == 0) {
    local_1 = false;
  }
  else {
    n = in_RDI;
    this_00 = impl::anon_unknown_0::get_allocator<pugi::xml_node_struct>
                        ((xml_node_struct *)in_RDI->header);
    bVar1 = impl::anon_unknown_0::xml_allocator::reserve(this_00);
    if (bVar1) {
      local_20 = *(long *)(in_RDI->header + 0x20);
      while (local_20 != 0) {
        local_20 = *(long *)(local_20 + 0x30);
        impl::anon_unknown_0::destroy_node(n,this_00);
      }
      *(undefined8 *)(in_RDI->header + 0x20) = 0;
      local_1 = true;
    }
    else {
      local_1 = false;
    }
  }
  return local_1;
}

Assistant:

PUGI_IMPL_FN bool xml_node::remove_children()
	{
		if (!_root) return false;

		impl::xml_allocator& alloc = impl::get_allocator(_root);
		if (!alloc.reserve()) return false;

		for (xml_node_struct* cur = _root->first_child; cur; )
		{
			xml_node_struct* next = cur->next_sibling;

			impl::destroy_node(cur, alloc);

			cur = next;
		}

		_root->first_child = NULL;

		return true;
	}